

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::GmmGen12CachePolicy::SelectNewPATIdx
          (GmmGen12CachePolicy *this,GMM_GFX_MEMORY_TYPE WantedMT,GMM_GFX_MEMORY_TYPE MT1,
          GMM_GFX_MEMORY_TYPE MT2)

{
  uint8_t local_1d;
  uint8_t SelectPAT2;
  GMM_GFX_MEMORY_TYPE MT2_local;
  GMM_GFX_MEMORY_TYPE MT1_local;
  GMM_GFX_MEMORY_TYPE WantedMT_local;
  GmmGen12CachePolicy *this_local;
  
  local_1d = '\0';
  if ((MT1 != WantedMT) && ((MT2 == WantedMT || (MT2 == GMM_GFX_UC_WITH_FENCE)))) {
    local_1d = '\x01';
  }
  return local_1d;
}

Assistant:

uint8_t GmmLib::GmmGen12CachePolicy::SelectNewPATIdx(GMM_GFX_MEMORY_TYPE WantedMT,
                                                     GMM_GFX_MEMORY_TYPE MT1, GMM_GFX_MEMORY_TYPE MT2)
{
    uint8_t SelectPAT2 = 0;

    // select on Memory Type
    if(MT1 != WantedMT)
    {
        if(MT2 == WantedMT || MT2 == GMM_GFX_UC_WITH_FENCE)
        {
            SelectPAT2 = 1;
        }
        goto EXIT;
    }

EXIT:
    return SelectPAT2;
}